

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswPairs.c
# Opt level: O1

Aig_Man_t * Ssw_SignalCorrespondeceTestPairs(Aig_Man_t *pAig)

{
  uint uVar1;
  void *pvVar2;
  int iVar3;
  Aig_Man_t *pAig2;
  Vec_Int_t *p;
  int *piVar4;
  Vec_Int_t *p_00;
  Vec_Ptr_t *pVVar5;
  Aig_Man_t *p_01;
  long lVar6;
  int iVar7;
  ulong uVar8;
  char *format;
  Vec_Int_t *__size;
  Aig_Man_t *pAVar9;
  timespec ts_1;
  Ssw_Pars_t Pars;
  long local_f0;
  timespec local_e8;
  Ssw_Pars_t local_d8;
  
  iVar3 = clock_gettime(3,(timespec *)&local_d8);
  if (iVar3 < 0) {
    local_f0 = 1;
  }
  else {
    lVar6 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816((long)local_d8._8_8_),8);
    local_f0 = ((lVar6 >> 7) - (lVar6 >> 0x3f)) + local_d8._0_8_ * -1000000;
  }
  Ssw_ManSetDefaultParams(&local_d8);
  local_d8.fVerbose = 1;
  pAig2 = Ssw_SignalCorrespondence(pAig,&local_d8);
  iVar3 = pAig->vObjs->nSize;
  p = (Vec_Int_t *)malloc(0x10);
  iVar7 = 0x10;
  if (0xe < iVar3 - 1U) {
    iVar7 = iVar3;
  }
  p->nSize = 0;
  p->nCap = iVar7;
  if (iVar7 == 0) {
    piVar4 = (int *)0x0;
  }
  else {
    piVar4 = (int *)malloc((long)iVar7 * 4);
  }
  p->pArray = piVar4;
  __size = (Vec_Int_t *)&DAT_00000010;
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nSize = 0;
  p_00->nCap = iVar7;
  if (iVar7 == 0) {
    piVar4 = (int *)0x0;
  }
  else {
    __size = (Vec_Int_t *)((long)iVar7 << 2);
    piVar4 = (int *)malloc((size_t)__size);
  }
  iVar3 = (int)__size;
  p_00->pArray = piVar4;
  pVVar5 = pAig->vObjs;
  uVar8 = (ulong)(uint)pVVar5->nSize;
  if (0 < pVVar5->nSize) {
    lVar6 = 0;
    do {
      pvVar2 = pVVar5->pArray[lVar6];
      if (((pvVar2 != (void *)0x0) &&
          (uVar8 = *(ulong *)((long)pvVar2 + 0x28) & 0xfffffffffffffffe, uVar8 != 0)) &&
         (pVVar5 = pAig2->vObjs, pVVar5 != (Vec_Ptr_t *)0x0)) {
        uVar1 = *(uint *)(uVar8 + 0x24);
        if (((int)uVar1 < 0) || (pVVar5->nSize <= (int)uVar1)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        if (pVVar5->pArray[uVar1] != (void *)0x0) {
          Vec_IntPush(p,*(int *)((long)pvVar2 + 0x24));
          __size = p_00;
          Vec_IntPush(p_00,*(int *)(uVar8 + 0x24));
        }
      }
      iVar3 = (int)__size;
      lVar6 = lVar6 + 1;
      pVVar5 = pAig->vObjs;
      uVar8 = (ulong)pVVar5->nSize;
    } while (lVar6 < (long)uVar8);
  }
  Abc_Print(iVar3,"Recorded %d pairs (before: %d  after: %d).\n",(ulong)(uint)p->nSize,uVar8,
            (ulong)(uint)pAig2->vObjs->nSize);
  p_01 = Ssw_SignalCorrespondenceWithPairs(pAig,pAig2,p,p_00,&local_d8);
  if (p->pArray != (int *)0x0) {
    free(p->pArray);
    p->pArray = (int *)0x0;
  }
  free(p);
  if (p_00->pArray != (int *)0x0) {
    free(p_00->pArray);
    p_00->pArray = (int *)0x0;
  }
  free(p_00);
  pAVar9 = p_01;
  iVar3 = Ssw_MiterStatus(p_01,1);
  iVar7 = (int)pAVar9;
  if (iVar3 == 0) {
    format = "Verification failed with the counter-example.  ";
  }
  else {
    if (iVar3 != 1) {
      Abc_Print(iVar7,"Verification UNDECIDED. Remaining registers %d (total %d).  ",
                (ulong)(uint)p_01->nRegs,(ulong)(uint)(pAig2->nRegs + pAig->nRegs));
      goto LAB_006a37ae;
    }
    format = "Verification successful.  ";
  }
  Abc_Print(iVar7,format);
LAB_006a37ae:
  Abc_Print(iVar7,"%s =","Time");
  iVar7 = 3;
  iVar3 = clock_gettime(3,&local_e8);
  if (iVar3 < 0) {
    lVar6 = -1;
  }
  else {
    lVar6 = local_e8.tv_nsec / 1000 + local_e8.tv_sec * 1000000;
  }
  Abc_Print(iVar7,"%9.2f sec\n",(double)(lVar6 + local_f0) / 1000000.0);
  Aig_ManStop(pAig2);
  return p_01;
}

Assistant:

Aig_Man_t * Ssw_SignalCorrespondeceTestPairs( Aig_Man_t * pAig )
{
    Aig_Man_t * pAigNew, * pAigRes;
    Ssw_Pars_t Pars, * pPars = &Pars;
    Vec_Int_t * vIds1, * vIds2;
    Aig_Obj_t * pObj, * pRepr;
    int RetValue, i;
    abctime clk = Abc_Clock();
    Ssw_ManSetDefaultParams( pPars );
    pPars->fVerbose = 1;
    pAigNew = Ssw_SignalCorrespondence( pAig, pPars );
    // record pairs of equivalent nodes
    vIds1 = Vec_IntAlloc( Aig_ManObjNumMax(pAig) );
    vIds2 = Vec_IntAlloc( Aig_ManObjNumMax(pAig) );
    Aig_ManForEachObj( pAig, pObj, i )
    {
        pRepr = Aig_Regular((Aig_Obj_t *)pObj->pData);
        if ( pRepr == NULL )
            continue;
        if ( Aig_ManObj(pAigNew, pRepr->Id) == NULL )
            continue;
/*
        if ( Aig_ObjIsNode(pObj) )
            Abc_Print( 1, "n " );
        else if ( Saig_ObjIsPi(pAig, pObj) )
            Abc_Print( 1, "pi " );
        else if ( Saig_ObjIsLo(pAig, pObj) )
            Abc_Print( 1, "lo " );
*/
        Vec_IntPush( vIds1, Aig_ObjId(pObj) );
        Vec_IntPush( vIds2, Aig_ObjId(pRepr) );
    }
    Abc_Print( 1, "Recorded %d pairs (before: %d  after: %d).\n", Vec_IntSize(vIds1), Aig_ManObjNumMax(pAig), Aig_ManObjNumMax(pAigNew) );
    // try the new AIGs
    pAigRes = Ssw_SignalCorrespondenceWithPairs( pAig, pAigNew, vIds1, vIds2, pPars );
    Vec_IntFree( vIds1 );
    Vec_IntFree( vIds2 );
    // report the results
    RetValue = Ssw_MiterStatus( pAigRes, 1 );
    if ( RetValue == 1 )
        Abc_Print( 1, "Verification successful.  " );
    else if ( RetValue == 0 )
        Abc_Print( 1, "Verification failed with the counter-example.  " );
    else
        Abc_Print( 1, "Verification UNDECIDED. Remaining registers %d (total %d).  ",
            Aig_ManRegNum(pAigRes), Aig_ManRegNum(pAig) + Aig_ManRegNum(pAigNew) );
    ABC_PRT( "Time", Abc_Clock() - clk );
    // cleanup
    Aig_ManStop( pAigNew );
    return pAigRes;
}